

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

size_t __thiscall
ON_Write3dmBufferArchive::Internal_WriteOverride
          (ON_Write3dmBufferArchive *this,size_t sz,void *buffer)

{
  void *buffer_local;
  size_t sz_local;
  ON_Write3dmBufferArchive *this_local;
  
  if ((sz == 0) || (buffer == (void *)0x0)) {
    this_local = (ON_Write3dmBufferArchive *)0x0;
  }
  else {
    if (this->m_sizeof_buffer < this->m_buffer_position + sz) {
      AllocBuffer(this,this->m_buffer_position + sz);
    }
    if (this->m_sizeof_buffer < this->m_buffer_position + sz) {
      this_local = (ON_Write3dmBufferArchive *)0x0;
    }
    else {
      memcpy(this->m_buffer + this->m_buffer_position,buffer,sz);
      this->m_buffer_position = sz + this->m_buffer_position;
      this_local = (ON_Write3dmBufferArchive *)sz;
      if (this->m_sizeof_archive < this->m_buffer_position) {
        this->m_sizeof_archive = this->m_buffer_position;
      }
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t ON_Write3dmBufferArchive::Internal_WriteOverride( size_t sz, const void* buffer )
{
  if ( sz <= 0 || 0 == buffer )
    return 0;

  if ( m_buffer_position + sz > m_sizeof_buffer )
  {
    AllocBuffer(m_buffer_position + sz);
  }

  if ( m_buffer_position + sz > m_sizeof_buffer )
    return 0;

  memcpy( m_buffer + m_buffer_position, buffer, sz );
  m_buffer_position += sz;
  if ( m_buffer_position > m_sizeof_archive )
    m_sizeof_archive = m_buffer_position;

  return sz;
}